

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBString::findreplace(CBString *this,char *sfind,char *repl,int pos)

{
  int iVar1;
  size_t sVar2;
  CBStringException *pCVar3;
  CBStringException bstr__cppwrapper_exception;
  tagbstring u;
  tagbstring t;
  string local_b8;
  string local_98;
  CBStringException local_78;
  tagbstring local_50;
  tagbstring local_40;
  
  if ((sfind != (char *)0x0) && (repl != (char *)0x0)) {
    local_40.data = (uchar *)sfind;
    sVar2 = strlen(sfind);
    local_40.slen = (int)sVar2;
    local_40.mlen = -1;
    local_50.data = (uchar *)repl;
    sVar2 = strlen(repl);
    local_50.slen = (int)sVar2;
    local_50.mlen = -1;
    iVar1 = bfindreplace(&this->super_tagbstring,&local_40,&local_50,pos);
    if (iVar1 != -1) {
      return;
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"CBString::Failure in findreplace","");
    CBStringException::CBStringException(&local_78,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&local_78);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"CBString::findreplace NULL.","");
  CBStringException::CBStringException(&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar3,&local_78);
  __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::findreplace (const char * sfind, const char * repl, int pos) {
struct tagbstring t, u;
	if (NULL == repl || NULL == sfind) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("findreplace NULL.");
#else
		return;
#endif
	}
	cstr2tbstr (t, sfind);
	cstr2tbstr (u, repl);
	if (BSTR_ERR == bfindreplace (this, (bstring) &t, (bstring) &u, pos)) {
		bstringThrow ("Failure in findreplace");
	}
}